

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  BasicHeapType BVar1;
  RefNull *this_00;
  HeapType local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  this_00 = (RefNull *)MixedArena::allocSpace(&this->wasm->allocator,0x10,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression._id = RefNullId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type.id = 0;
  BVar1 = HeapType::getBottom(&local_20);
  if (((uint)(0x7c < BVar1) * 4 + 3 & BVar1) == 0) {
    RefNull::finalize(this_00,(Type)((ulong)BVar1 | 2));
    return this_00;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }